

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferRangeCase::init
          (ModifyAfterWithMapBufferRangeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  char *pcVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_198;
  
  local_198.m_log =
       ((this->
        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Testing performance of MapBufferRange() command after a draw command that sources data from the target buffer.\n"
                 );
  pcVar2 = "Whole buffer is mapped.\n";
  if (this->m_partialUpload != false) {
    pcVar2 = "Half of the buffer is mapped.\n";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,"Map bits:\n");
  pcVar2 = "\tGL_MAP_WRITE_BIT\n";
  if ((this->m_mapFlags & 2) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_READ_BIT\n";
  if ((this->m_mapFlags & 1) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  if ((this->m_mapFlags & 4) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  if ((this->m_mapFlags & 8) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  if ((this->m_mapFlags & 0x20) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "\tGL_MAP_FLUSH_EXPLICIT_BIT\n";
  if ((this->m_mapFlags & 0x10) == 0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          ::init(&this->
                  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void ModifyAfterWithMapBufferRangeCase::init (void)
{
	// Log the purpose of the test

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance of MapBufferRange() command after a draw command that sources data from the target buffer.\n"
		<< ((m_partialUpload) ?
			("Half of the buffer is mapped.\n") :
			("Whole buffer is mapped.\n"))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_FLUSH_EXPLICIT_BIT) ? ("\tGL_MAP_FLUSH_EXPLICIT_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	ModifyAfterBasicCase<MapBufferRangeDurationNoAlloc>::init();
}